

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

unique_ptr<wallet::SQLiteDatabase,_std::default_delete<wallet::SQLiteDatabase>_> __thiscall
wallet::MakeSQLiteDatabase
          (wallet *this,path *path,DatabaseOptions *options,DatabaseStatus *status,
          bilingual_str *error)

{
  bool bVar1;
  long in_FS_OFFSET;
  path data_file;
  path local_c0;
  undefined1 local_98 [104];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  SQLiteDataFile((path *)local_98,path);
  std::filesystem::__cxx11::path::parent_path();
  std::
  make_unique<wallet::SQLiteDatabase,std::filesystem::__cxx11::path,fs::path&,wallet::DatabaseOptions_const&>
            (&local_c0,(path *)(local_98 + 0x40),(DatabaseOptions *)local_98);
  std::filesystem::__cxx11::path::~path((path *)(local_98 + 0x40));
  if (options->verify == true) {
    bVar1 = SQLiteDatabase::Verify((SQLiteDatabase *)local_c0._M_pathname._M_dataplus._M_p,error);
    if (!bVar1) {
      *status = FAILED_VERIFY;
      *(undefined8 *)this = 0;
      if ((SQLiteDatabase *)local_c0._M_pathname._M_dataplus._M_p != (SQLiteDatabase *)0x0) {
        (**(code **)(*(long *)local_c0._M_pathname._M_dataplus._M_p + 8))();
      }
      goto LAB_004a7c06;
    }
  }
  *status = SUCCESS;
  *(pointer *)this = local_c0._M_pathname._M_dataplus._M_p;
LAB_004a7c06:
  std::filesystem::__cxx11::path::~path((path *)local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (__uniq_ptr_data<wallet::SQLiteDatabase,_std::default_delete<wallet::SQLiteDatabase>,_true,_true>
            )(__uniq_ptr_data<wallet::SQLiteDatabase,_std::default_delete<wallet::SQLiteDatabase>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<SQLiteDatabase> MakeSQLiteDatabase(const fs::path& path, const DatabaseOptions& options, DatabaseStatus& status, bilingual_str& error)
{
    try {
        fs::path data_file = SQLiteDataFile(path);
        auto db = std::make_unique<SQLiteDatabase>(data_file.parent_path(), data_file, options);
        if (options.verify && !db->Verify(error)) {
            status = DatabaseStatus::FAILED_VERIFY;
            return nullptr;
        }
        status = DatabaseStatus::SUCCESS;
        return db;
    } catch (const std::runtime_error& e) {
        status = DatabaseStatus::FAILED_LOAD;
        error = Untranslated(e.what());
        return nullptr;
    }
}